

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O0

int aom_count_primitive_refsubexpfin(uint16_t n,uint16_t k,uint16_t ref,uint16_t v)

{
  int iVar1;
  uint16_t unaff_retaddr;
  uint16_t unaff_retaddr_00;
  uint16_t unaff_retaddr_01;
  
  recenter_finite_nonneg(0,0x3a,0xfaf2);
  iVar1 = count_primitive_subexpfin(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr);
  return iVar1;
}

Assistant:

int aom_count_primitive_refsubexpfin(uint16_t n, uint16_t k, uint16_t ref,
                                     uint16_t v) {
  return count_primitive_subexpfin(n, k, recenter_finite_nonneg(n, ref, v));
}